

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O0

GLsizei getNumberOfTriangles(DelaunayTriangulation *delTri)

{
  void *__ptr;
  int local_34;
  Edge *pEStack_30;
  GLsizei i;
  Edge *e;
  GLsizei n_triangles;
  char *visited_edges;
  DelaunayTriangulation *delTri_local;
  
  if ((delTri->n_points < 3) || (delTri->success == 0)) {
    delTri_local._4_4_ = 0;
  }
  else {
    __ptr = calloc((long)delTri->n_edges,1);
    e._4_4_ = 0;
    for (local_34 = 0; local_34 < delTri->n_edges; local_34 = local_34 + 1) {
      pEStack_30 = delTri->edges + local_34;
      if ((pEStack_30->discarded == 0) && (*(char *)((long)__ptr + (long)local_34) == '\0')) {
        do {
          *(undefined1 *)((long)__ptr + (long)pEStack_30->idx) = 1;
          pEStack_30 = pEStack_30->onext->sym;
        } while (pEStack_30->idx != local_34);
        e._4_4_ = e._4_4_ + 1;
      }
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    delTri_local._4_4_ = e._4_4_ + -1;
  }
  return delTri_local._4_4_;
}

Assistant:

GLsizei getNumberOfTriangles(DelaunayTriangulation *delTri) {
	if ((delTri->n_points < 3) || (!delTri->success)) {
		return 0;
	}
	char *visited_edges = calloc(delTri->n_edges, sizeof(char));
	GLsizei n_triangles = 0;
	Edge *e;

	for (GLsizei i = 0; i < delTri->n_edges; i++) {
		e = &(delTri->edges[i]);
		if ((!e->discarded) && (visited_edges[i] == 0)) {
			do {
				visited_edges[e->idx] = 1;
				e = e->onext->sym;
			} while (e->idx != i);
			n_triangles ++;
		}
	}

	if (visited_edges != NULL) free(visited_edges);

	return n_triangles - 1; // Remove the "outside"

}